

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O3

iterator mapFdAcByIdx(int idx)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mapFdMutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  p_Var3 = &mapFd._M_t._M_impl.super__Rb_tree_header._M_header;
  if ((_Rb_tree_header *)mapFd._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &mapFd._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = 0;
    p_Var2 = mapFd._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if ((p_Var2[0x1d]._M_left != (_Base_ptr)0x0) &&
         (iVar1 = iVar1 + 1, p_Var3 = p_Var2, iVar1 == idx)) break;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      p_Var3 = &mapFd._M_t._M_impl.super__Rb_tree_header._M_header;
    } while ((_Rb_tree_header *)p_Var2 != &mapFd._M_t._M_impl.super__Rb_tree_header);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&mapFdMutex);
  return (iterator)p_Var3;
}

Assistant:

mapLTFlightDataTy::iterator mapFdAcByIdx (int idx)
{
    // access guarded by the fd mutex
    std::lock_guard<std::mutex> lock (mapFdMutex);
    // let's find the i-th aircraft by looping over all flight data
    // and count those objects, which have an a/c
    int i = 0;
    for (mapLTFlightDataTy::iterator fdIter = mapFd.begin();
         fdIter != mapFd.end();
         ++fdIter)
    {
        if (fdIter->second.hasAc())         // has an a/c
            if ( ++i == idx )               // and it's the i-th!
                return fdIter;
    }
    
    // not found
    return mapFd.end();
}